

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_top_n.cpp
# Opt level: O2

void __thiscall duckdb::TopNGlobalSourceState::~TopNGlobalSourceState(TopNGlobalSourceState *this)

{
  ~TopNGlobalSourceState(this);
  operator_delete(this);
  return;
}

Assistant:

explicit TopNGlobalSourceState(TopNGlobalSinkState &sink_p) : sink(sink_p), batch_index(0) {
		sink.heap.InitializeScan(state, true);
	}